

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::NanoVDBMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          NanoVDBMediumProvider *this,Allocator alloc,Point3i *res)

{
  int iVar1;
  size_t n;
  Point3i *local_70;
  long *local_68;
  undefined8 uStack_60;
  code *pcStack_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  (res->super_Tuple3<pbrt::Point3,_int>).x = 0x40;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 0x40;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 0x40;
  iVar1 = 0x40000;
  local_70 = res;
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.h"
        ,0x291,"Starting nanovdb grid GetMaxDensityGrid()");
    iVar1 = (res->super_Tuple3<pbrt::Point3,_int>).y * (res->super_Tuple3<pbrt::Point3,_int>).x *
            (res->super_Tuple3<pbrt::Point3,_int>).z;
  }
  n = (size_t)iVar1;
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (float *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(__return_storage_ptr__,n);
  if (iVar1 != 0) {
    memset(__return_storage_ptr__->ptr,0,n * 4);
  }
  __return_storage_ptr__->nStored = n;
  local_68 = (long *)0x0;
  uStack_60 = 0;
  pcStack_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68 = (long *)operator_new(0x18);
  local_48._M_unused._M_object = &local_68;
  *local_68 = (long)&local_70;
  pcStack_50 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.h:661:40)>
               ::_M_invoke;
  pcStack_58 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.h:661:40)>
               ::_M_manager;
  local_68[1] = (long)this;
  local_68[2] = (long)__return_storage_ptr__;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
  ParallelFor(0,n,(function<void_(long,_long)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (pcStack_58 != (code *)0x0) {
    (*pcStack_58)(&local_68,&local_68,3);
  }
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.h"
        ,0x2c1,"Finished nanovdb grid GetMaxDensityGrid()");
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
#if 0
    // For debugging: single, medium-wide majorant...
    *res = Point3i(1, 1, 1);
    Float minDensity, maxDensity;
    densityFloatGrid->tree().extrema(minDensity, maxDensity);
    return pstd::vector<Float>(1, maxDensity, alloc);
#else
        *res = Point3i(64, 64, 64);

        LOG_VERBOSE("Starting nanovdb grid GetMaxDensityGrid()");

        pstd::vector<Float> maxGrid(res->x * res->y * res->z, 0.f, alloc);

        ParallelFor(0, maxGrid.size(), [&](size_t index) {
            // Indices into maxGrid
            int x = index % res->x;
            int y = (index / res->x) % res->y;
            int z = index / (res->x * res->y);
            CHECK_EQ(index, x + res->x * (y + res->y * z));

            // World (aka medium) space bounds of this max grid cell
            Bounds3f wb(bounds.Lerp(Point3f(Float(x) / res->x, Float(y) / res->y,
                                            Float(z) / res->z)),
                        bounds.Lerp(Point3f(Float(x + 1) / res->x, Float(y + 1) / res->y,
                                            Float(z + 1) / res->z)));

            // Compute corresponding NanoVDB index-space bounds in floating-point.
            nanovdb::Vec3R i0 = densityFloatGrid->worldToIndexF(
                nanovdb::Vec3R(wb.pMin.x, wb.pMin.y, wb.pMin.z));
            nanovdb::Vec3R i1 = densityFloatGrid->worldToIndexF(
                nanovdb::Vec3R(wb.pMax.x, wb.pMax.y, wb.pMax.z));

            // Now find integer index-space bounds, accounting for both
            // filtering and the overall index bounding box.
            auto bbox = densityFloatGrid->indexBBox();
            Float delta = 1.f;  // Filter slop
            int nx0 = std::max(int(i0[0] - delta), bbox.min()[0]);
            int nx1 = std::min(int(i1[0] + delta), bbox.max()[0]);
            int ny0 = std::max(int(i0[1] - delta), bbox.min()[1]);
            int ny1 = std::min(int(i1[1] + delta), bbox.max()[1]);
            int nz0 = std::max(int(i0[2] - delta), bbox.min()[2]);
            int nz1 = std::min(int(i1[2] + delta), bbox.max()[2]);

            Float maxValue = 0;
            auto accessor = densityFloatGrid->getAccessor();
            // Apparently nanovdb integer bounding boxes are inclusive on
            // the upper end...
            for (int nz = nz0; nz <= nz1; ++nz)
                for (int ny = ny0; ny <= ny1; ++ny)
                    for (int nx = nx0; nx <= nx1; ++nx)
                        maxValue = std::max(maxValue, accessor.getValue({nx, ny, nz}));

            // Only write into maxGrid once when we're done to minimize
            // cache thrashing..
            maxGrid[index] = maxValue;
        });

        LOG_VERBOSE("Finished nanovdb grid GetMaxDensityGrid()");
        return maxGrid;
#endif
    }